

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem_const&>
          (QPodArrayOps<QScriptItem> *this,qsizetype i,QScriptItem *args)

{
  QScriptItem **ppQVar1;
  qsizetype *pqVar2;
  int iVar3;
  Data *pDVar4;
  long lVar5;
  undefined8 uVar6;
  QScriptItem *pQVar7;
  QFixed QVar8;
  QScriptAnalysis QVar9;
  unsigned_short uVar10;
  undefined2 uVar11;
  QFixed QVar12;
  int iVar13;
  QFixed QVar14;
  QFixed QVar15;
  qsizetype qVar16;
  QScriptItem *pQVar17;
  GrowthPosition where;
  
  pDVar4 = (this->super_QArrayDataPointer<QScriptItem>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QScriptItem>).size == i) &&
       (qVar16 = QArrayDataPointer<QScriptItem>::freeSpaceAtEnd
                           (&this->super_QArrayDataPointer<QScriptItem>), qVar16 != 0)) {
      pQVar17 = (this->super_QArrayDataPointer<QScriptItem>).ptr;
      lVar5 = (this->super_QArrayDataPointer<QScriptItem>).size;
      iVar3 = args->position;
      QVar9 = args->analysis;
      uVar10 = args->num_glyphs;
      uVar11 = *(undefined2 *)&args->field_0xa;
      QVar12.val = (args->descent).val;
      QVar8.val = (args->leading).val;
      uVar6 = *(undefined8 *)&args->width;
      pQVar7 = pQVar17 + lVar5;
      pQVar7->ascent = (QFixed)(args->ascent).val;
      pQVar7->leading = (QFixed)QVar8.val;
      *(undefined8 *)(&pQVar7->ascent + 2) = uVar6;
      pQVar17 = pQVar17 + lVar5;
      pQVar17->position = iVar3;
      pQVar17->analysis = QVar9;
      pQVar17->num_glyphs = uVar10;
      *(undefined2 *)&pQVar17->field_0xa = uVar11;
      pQVar17->descent = (QFixed)QVar12.val;
    }
    else {
      if ((i != 0) ||
         (qVar16 = QArrayDataPointer<QScriptItem>::freeSpaceAtBegin
                             (&this->super_QArrayDataPointer<QScriptItem>), qVar16 == 0))
      goto LAB_0048b767;
      pQVar17 = (this->super_QArrayDataPointer<QScriptItem>).ptr;
      iVar13 = args->position;
      QVar9 = args->analysis;
      uVar10 = args->num_glyphs;
      uVar11 = *(undefined2 *)&args->field_0xa;
      QVar14.val = (args->descent).val;
      QVar8.val = (args->leading).val;
      QVar12.val = (args->width).val;
      iVar3 = args->glyph_data_offset;
      pQVar17[-1].ascent = (QFixed)(args->ascent).val;
      pQVar17[-1].leading = (QFixed)QVar8.val;
      pQVar17[-1].width = (QFixed)QVar12.val;
      pQVar17[-1].glyph_data_offset = iVar3;
      pQVar17[-1].position = iVar13;
      pQVar17[-1].analysis = QVar9;
      pQVar17[-1].num_glyphs = uVar10;
      *(undefined2 *)&pQVar17[-1].field_0xa = uVar11;
      pQVar17[-1].descent = (QFixed)QVar14.val;
      ppQVar1 = &(this->super_QArrayDataPointer<QScriptItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QScriptItem>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_0048b767:
  uVar10 = args->num_glyphs;
  uVar11 = *(undefined2 *)&args->field_0xa;
  iVar3 = args->glyph_data_offset;
  QVar8.val = (args->descent).val;
  QVar12.val = (args->ascent).val;
  QVar14.val = (args->leading).val;
  QVar15.val = (args->width).val;
  iVar13 = args->position;
  QVar9 = args->analysis;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QScriptItem>).size != 0);
  QArrayDataPointer<QScriptItem>::detachAndGrow
            (&this->super_QArrayDataPointer<QScriptItem>,where,1,(QScriptItem **)0x0,
             (QArrayDataPointer<QScriptItem> *)0x0);
  pQVar17 = createHole(this,where,i,1);
  pQVar17->position = iVar13;
  pQVar17->analysis = QVar9;
  pQVar17->num_glyphs = uVar10;
  *(undefined2 *)&pQVar17->field_0xa = uVar11;
  pQVar17->descent = (QFixed)QVar8.val;
  pQVar17->ascent = (QFixed)QVar12.val;
  pQVar17->leading = (QFixed)QVar14.val;
  pQVar17->width = (QFixed)QVar15.val;
  pQVar17->glyph_data_offset = iVar3;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }